

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O2

void Sfm_NtkFree(Sfm_Ntk_t *p)

{
  int *piVar1;
  Vec_Str_t *pVVar2;
  Vec_Wrd_t *__ptr;
  
  pVVar2 = p->vFixed;
  free(pVVar2->pArray);
  free(pVVar2);
  pVVar2 = p->vEmpty;
  if (pVVar2 != (Vec_Str_t *)0x0) {
    if (pVVar2->pArray != (char *)0x0) {
      free(pVVar2->pArray);
      p->vEmpty->pArray = (char *)0x0;
      pVVar2 = p->vEmpty;
      if (pVVar2 == (Vec_Str_t *)0x0) goto LAB_00451a7f;
    }
    free(pVVar2);
    p->vEmpty = (Vec_Str_t *)0x0;
  }
LAB_00451a7f:
  Vec_WrdFree(p->vTruths);
  Vec_WecErase(&p->vFanins);
  Vec_IntFree(p->vStarts);
  Vec_WrdFree(p->vTruths2);
  Vec_WecErase(&p->vFanouts);
  piVar1 = (p->vLevels).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vLevels).pArray = (int *)0x0;
  }
  piVar1 = (p->vLevelsR).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vLevelsR).pArray = (int *)0x0;
  }
  piVar1 = (p->vCounts).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCounts).pArray = (int *)0x0;
  }
  piVar1 = (p->vTravIds).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vTravIds).pArray = (int *)0x0;
  }
  piVar1 = (p->vTravIds2).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vTravIds2).pArray = (int *)0x0;
  }
  piVar1 = (p->vId2Var).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vId2Var).pArray = (int *)0x0;
  }
  piVar1 = (p->vVar2Id).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vVar2Id).pArray = (int *)0x0;
  }
  Vec_WecFree(p->vCnfs);
  Vec_IntFree(p->vCover);
  Vec_IntFreeP(&p->vNodes);
  Vec_IntFreeP(&p->vDivs);
  Vec_IntFreeP(&p->vRoots);
  Vec_IntFreeP(&p->vTfo);
  __ptr = p->vDivCexes;
  if (__ptr != (Vec_Wrd_t *)0x0) {
    if (__ptr->pArray != (word *)0x0) {
      free(__ptr->pArray);
      p->vDivCexes->pArray = (word *)0x0;
      __ptr = p->vDivCexes;
      if (__ptr == (Vec_Wrd_t *)0x0) goto LAB_00451bdf;
    }
    free(__ptr);
    p->vDivCexes = (Vec_Wrd_t *)0x0;
  }
LAB_00451bdf:
  Vec_IntFreeP(&p->vOrder);
  Vec_IntFreeP(&p->vDivVars);
  Vec_IntFreeP(&p->vDivIds);
  Vec_IntFreeP(&p->vLits);
  Vec_IntFreeP(&p->vValues);
  if (p->vClauses != (Vec_Wec_t *)0x0) {
    Vec_WecFree(p->vClauses);
    p->vClauses = (Vec_Wec_t *)0x0;
  }
  Vec_IntFreeP(&p->vFaninMap);
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
  }
  free(p);
  return;
}

Assistant:

void Sfm_NtkFree( Sfm_Ntk_t * p )
{
    // user data
    Vec_StrFree( p->vFixed );
    Vec_StrFreeP( &p->vEmpty );
    Vec_WrdFree( p->vTruths );
    Vec_WecErase( &p->vFanins );
    Vec_IntFree( p->vStarts );
    Vec_WrdFree( p->vTruths2 );
    // attributes
    Vec_WecErase( &p->vFanouts );
    ABC_FREE( p->vLevels.pArray );
    ABC_FREE( p->vLevelsR.pArray );
    ABC_FREE( p->vCounts.pArray );
    ABC_FREE( p->vTravIds.pArray );
    ABC_FREE( p->vTravIds2.pArray );
    ABC_FREE( p->vId2Var.pArray );
    ABC_FREE( p->vVar2Id.pArray );
    Vec_WecFree( p->vCnfs );
    Vec_IntFree( p->vCover );
    // other data
    Vec_IntFreeP( &p->vNodes );
    Vec_IntFreeP( &p->vDivs  );
    Vec_IntFreeP( &p->vRoots );
    Vec_IntFreeP( &p->vTfo   );
    Vec_WrdFreeP( &p->vDivCexes );
    Vec_IntFreeP( &p->vOrder );
    Vec_IntFreeP( &p->vDivVars );
    Vec_IntFreeP( &p->vDivIds );
    Vec_IntFreeP( &p->vLits  );
    Vec_IntFreeP( &p->vValues );
    Vec_WecFreeP( &p->vClauses );
    Vec_IntFreeP( &p->vFaninMap );
    if ( p->pSat  ) sat_solver_delete( p->pSat );
    ABC_FREE( p );
}